

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanoflann.hpp
# Opt level: O2

NodePtr __thiscall
nanoflann::
KDTreeBaseClass<nanoflann::KDTreeSingleIndexAdaptor<nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>,_nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>
::divideTree(KDTreeBaseClass<nanoflann::KDTreeSingleIndexAdaptor<nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>,_nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>
             *this,KDTreeSingleIndexAdaptor<nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>
                   *obj,unsigned_long left,unsigned_long right,BoundingBox *bbox)

{
  double *pdVar1;
  double dVar2;
  unsigned_long uVar3;
  pointer puVar4;
  undefined8 uVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  int iVar10;
  NodePtr pNVar11;
  unsigned_long *max_elem;
  ulong uVar12;
  NodePtr pNVar13;
  long lVar14;
  pointer puVar15;
  double *pdVar16;
  ulong uVar17;
  KDTreeSingleIndexAdaptor<nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>
  *pKVar18;
  ulong uVar19;
  BoundingBox *bbox_00;
  unsigned_long uVar21;
  ulong uVar22;
  bool bVar23;
  bool bVar24;
  double dVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [64];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [64];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  unsigned_long *puVar36;
  ulong local_c8;
  BoundingBox right_bbox;
  BoundingBox left_bbox;
  undefined7 uVar20;
  
  pNVar11 = (NodePtr)PooledAllocator::malloc(&this->pool,0x28);
  max_elem = (unsigned_long *)(left - (long)obj);
  if (max_elem <= (unsigned_long *)this->m_leaf_max_size) {
    pNVar11->child1 = (Node *)0x0;
    pNVar11->child2 = (Node *)0x0;
    (pNVar11->node_type).lr.left = (unsigned_long)obj;
    (pNVar11->node_type).lr.right = left;
    uVar21 = (this->vind).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start[(long)obj];
    uVar3 = *this[1].vind.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    for (lVar14 = 0; lVar14 != 0x18; lVar14 = lVar14 + 8) {
      uVar5 = *(undefined8 *)(uVar21 * 0x18 + uVar3 + lVar14);
      *(undefined8 *)(right + lVar14 * 2) = uVar5;
      *(undefined8 *)(right + 8 + lVar14 * 2) = uVar5;
    }
    puVar15 = (this->vind).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
              .super__Vector_impl_data._M_start;
    puVar4 = this[1].vind.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    while (obj = (KDTreeSingleIndexAdaptor<nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>
                  *)((long)&(obj->
                            super_KDTreeBaseClass<nanoflann::KDTreeSingleIndexAdaptor<nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>,_nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>
                            ).vind.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                            ._M_impl.super__Vector_impl_data._M_start + 1), obj < left) {
      uVar21 = puVar15[(long)obj];
      uVar3 = *puVar4;
      for (lVar14 = 0; lVar14 != 0x18; lVar14 = lVar14 + 8) {
        dVar25 = *(double *)(uVar21 * 0x18 + uVar3 + lVar14);
        if (dVar25 < *(double *)(right + lVar14 * 2)) {
          *(double *)(right + lVar14 * 2) = dVar25;
        }
        if (*(double *)(right + 8 + lVar14 * 2) < dVar25) {
          *(double *)(right + 8 + lVar14 * 2) = dVar25;
        }
      }
    }
    return pNVar11;
  }
  auVar28 = ZEXT864((ulong)(*(double *)(right + 8) - *(double *)right));
  lVar14 = 0x18;
  while (lVar14 != 0x38) {
    pdVar16 = (double *)(right + lVar14);
    pdVar1 = (double *)((right - 8) + lVar14);
    lVar14 = lVar14 + 0x10;
    auVar29._8_8_ = 0;
    auVar29._0_8_ = *pdVar16 - *pdVar1;
    auVar29 = vmaxsd_avx(auVar29,auVar28._0_16_);
    auVar28 = ZEXT1664(auVar29);
  }
  auVar33 = ZEXT1664(ZEXT816(0xbff0000000000000));
  pKVar18 = (KDTreeSingleIndexAdaptor<nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>
             *)((this->vind).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_start + (long)obj);
  pdVar16 = (double *)(right + 8);
  local_c8 = 0;
  uVar21 = 0;
  for (uVar22 = 0; uVar22 != 3; uVar22 = uVar22 + 1) {
    if (auVar28._0_8_ * 0.99999 < *pdVar16 - pdVar16[-1]) {
      auVar31._0_8_ = auVar33._0_8_;
      computeMinMax(this,pKVar18,max_elem,uVar22 & 0xffffffff,(int)&left_bbox,
                    (ElementType *)&right_bbox,(ElementType *)max_elem);
      auVar31._8_8_ = 0;
      dVar25 = right_bbox._M_elems[0].low - left_bbox._M_elems[0].low;
      auVar26._8_8_ = 0;
      auVar26._0_8_ = dVar25;
      auVar29 = vmaxsd_avx(auVar26,auVar31);
      auVar33 = ZEXT1664(auVar29);
      if (auVar31._0_8_ < dVar25) {
        local_c8 = uVar22;
      }
      local_c8 = local_c8 & 0xffffffff;
      if (auVar31._0_8_ < dVar25) {
        uVar21 = uVar22 & 0xffffffff;
      }
    }
    pdVar16 = pdVar16 + 2;
  }
  lVar14 = (long)(int)uVar21;
  bbox_00 = &left_bbox;
  dVar25 = *(double *)(right + lVar14 * 0x10);
  dVar2 = *(double *)(right + 8 + lVar14 * 0x10);
  puVar36 = max_elem;
  computeMinMax(this,pKVar18,max_elem,uVar21,(int)bbox_00,(ElementType *)&right_bbox,
                (ElementType *)max_elem);
  auVar34._8_8_ = 0;
  auVar34._0_8_ = (dVar25 + dVar2) * 0.5;
  uVar22 = (long)max_elem - 1;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = left_bbox._M_elems[0].low;
  auVar30._8_8_ = 0;
  auVar30._0_8_ = right_bbox._M_elems[0].low;
  uVar12 = 0;
  uVar5 = vcmpsd_avx512f(auVar34,auVar27,1);
  bVar23 = (bool)((byte)uVar5 & 1);
  auVar29 = vminsd_avx(auVar30,auVar34);
  dVar25 = (double)((ulong)bVar23 * (long)left_bbox._M_elems[0].low + (ulong)!bVar23 * auVar29._0_8_
                   );
  uVar19 = uVar22;
  do {
    puVar15 = this[1].vind.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
              .super__Vector_impl_data._M_start;
    while ((uVar12 <= uVar19 &&
           (*(double *)
             (*(long *)((long)((pKVar18->
                               super_KDTreeBaseClass<nanoflann::KDTreeSingleIndexAdaptor<nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>,_nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>
                               ).root_bbox._M_elems + -4) + uVar12 * 8) * 0x18 + *puVar15 +
             lVar14 * 8) < dVar25))) {
      uVar12 = uVar12 + 1;
    }
    while( true ) {
      bVar23 = uVar19 != 0;
      uVar20 = (undefined7)((ulong)bbox_00 >> 8);
      bbox_00 = (BoundingBox *)CONCAT71(uVar20,uVar12 <= uVar19);
      if ((uVar19 < uVar12) || (uVar19 == 0)) goto LAB_001909ca;
      if (*(double *)
           (*(long *)((long)((pKVar18->
                             super_KDTreeBaseClass<nanoflann::KDTreeSingleIndexAdaptor<nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>,_nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>
                             ).root_bbox._M_elems + -4) + uVar19 * 8) * 0x18 + *puVar15 + lVar14 * 8
           ) < dVar25) break;
      uVar19 = uVar19 - 1;
    }
    bbox_00 = (BoundingBox *)CONCAT71(uVar20,1);
    bVar23 = true;
LAB_001909ca:
    uVar17 = uVar12;
    if (((char)bbox_00 == '\0') || (!bVar23)) {
      do {
        while ((uVar17 <= uVar22 &&
               (*(double *)
                 (*(long *)((long)((pKVar18->
                                   super_KDTreeBaseClass<nanoflann::KDTreeSingleIndexAdaptor<nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>,_nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>
                                   ).root_bbox._M_elems + -4) + uVar17 * 8) * 0x18 + *puVar15 +
                 lVar14 * 8) <= dVar25))) {
          uVar17 = uVar17 + 1;
        }
        while( true ) {
          bVar24 = uVar22 != 0;
          bVar23 = uVar17 <= uVar22;
          if ((uVar22 < uVar17) || (uVar22 == 0)) goto LAB_00190a3b;
          if (*(double *)
               (*(long *)((long)((pKVar18->
                                 super_KDTreeBaseClass<nanoflann::KDTreeSingleIndexAdaptor<nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>,_nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>
                                 ).root_bbox._M_elems + -4) + uVar22 * 8) * 0x18 + *puVar15 +
               lVar14 * 8) <= dVar25) break;
          uVar22 = uVar22 - 1;
        }
        bVar23 = true;
        bVar24 = true;
LAB_00190a3b:
        if ((!bVar23) || (!bVar24)) {
          uVar22 = (ulong)puVar36 >> 1;
          if (uVar22 <= uVar17) {
            uVar17 = uVar22;
          }
          if (uVar22 < uVar12) {
            uVar17 = uVar12;
          }
          pKVar18 = (KDTreeSingleIndexAdaptor<nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>
                     *)((long)((obj->
                               super_KDTreeBaseClass<nanoflann::KDTreeSingleIndexAdaptor<nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>,_nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>
                               ).root_bbox._M_elems + -4) + uVar17);
          iVar10 = (int)local_c8;
          (pNVar11->node_type).sub.divfeat = iVar10;
          left_bbox._M_elems[0].low = *(ElementType *)right;
          left_bbox._M_elems[0].high = *(ElementType *)(right + 8);
          left_bbox._M_elems[1].low = *(ElementType *)(right + 0x10);
          left_bbox._M_elems[1].high = *(ElementType *)(right + 0x18);
          left_bbox._M_elems[2].low = *(ElementType *)(right + 0x20);
          left_bbox._M_elems[2].high = *(ElementType *)(right + 0x28);
          left_bbox._M_elems[iVar10].high = dVar25;
          pNVar13 = divideTree(this,obj,(unsigned_long)pKVar18,(unsigned_long)&left_bbox,bbox_00);
          pNVar11->child1 = pNVar13;
          right_bbox._M_elems[0].low = *(ElementType *)right;
          right_bbox._M_elems[0].high = *(ElementType *)(right + 8);
          right_bbox._M_elems[1].low = *(ElementType *)(right + 0x10);
          right_bbox._M_elems[1].high = *(ElementType *)(right + 0x18);
          right_bbox._M_elems[2].low = *(ElementType *)(right + 0x20);
          right_bbox._M_elems[2].high = *(ElementType *)(right + 0x28);
          right_bbox._M_elems[iVar10].low = dVar25;
          pNVar13 = divideTree(this,pKVar18,left,(unsigned_long)&right_bbox,bbox_00);
          pNVar11->child2 = pNVar13;
          (pNVar11->node_type).lr.right = (unsigned_long)left_bbox._M_elems[iVar10].high;
          (pNVar11->node_type).sub.divhigh = right_bbox._M_elems[iVar10].low;
          for (lVar14 = 0; lVar14 != 0x30; lVar14 = lVar14 + 0x10) {
            lVar6 = *(long *)((long)&left_bbox._M_elems[0].low + lVar14);
            lVar7 = *(long *)((long)&left_bbox._M_elems[0].high + lVar14);
            lVar8 = *(long *)((long)&right_bbox._M_elems[0].low + lVar14);
            lVar9 = *(long *)((long)&right_bbox._M_elems[0].high + lVar14);
            auVar32._8_8_ = lVar7;
            auVar32._0_8_ = lVar8;
            auVar35._8_8_ = lVar9;
            auVar35._0_8_ = lVar6;
            uVar22 = vcmppd_avx512vl(auVar32,auVar35,1);
            bVar23 = (bool)((byte)(uVar22 & 3) & 1);
            uVar22 = (uVar22 & 3) >> 1;
            *(ulong *)(right + lVar14) = (ulong)bVar23 * lVar8 | (ulong)!bVar23 * lVar6;
            ((ulong *)(right + lVar14))[1] = uVar22 * lVar9 | (ulong)!SUB81(uVar22,0) * lVar7;
          }
          return pNVar11;
        }
        uVar5 = *(undefined8 *)
                 ((long)((pKVar18->
                         super_KDTreeBaseClass<nanoflann::KDTreeSingleIndexAdaptor<nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>,_nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>
                         ).root_bbox._M_elems + -4) + uVar17 * 8);
        *(undefined8 *)
         ((long)((pKVar18->
                 super_KDTreeBaseClass<nanoflann::KDTreeSingleIndexAdaptor<nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>,_nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>
                 ).root_bbox._M_elems + -4) + uVar17 * 8) =
             *(undefined8 *)
              ((long)((pKVar18->
                      super_KDTreeBaseClass<nanoflann::KDTreeSingleIndexAdaptor<nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>,_nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>
                      ).root_bbox._M_elems + -4) + uVar22 * 8);
        *(undefined8 *)
         ((long)((pKVar18->
                 super_KDTreeBaseClass<nanoflann::KDTreeSingleIndexAdaptor<nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>,_nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>
                 ).root_bbox._M_elems + -4) + uVar22 * 8) = uVar5;
        uVar22 = uVar22 - 1;
        puVar15 = this[1].vind.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        uVar17 = uVar17 + 1;
      } while( true );
    }
    uVar5 = *(undefined8 *)
             ((long)((pKVar18->
                     super_KDTreeBaseClass<nanoflann::KDTreeSingleIndexAdaptor<nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>,_nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>
                     ).root_bbox._M_elems + -4) + uVar12 * 8);
    *(undefined8 *)
     ((long)((pKVar18->
             super_KDTreeBaseClass<nanoflann::KDTreeSingleIndexAdaptor<nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>,_nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>
             ).root_bbox._M_elems + -4) + uVar12 * 8) =
         *(undefined8 *)
          ((long)((pKVar18->
                  super_KDTreeBaseClass<nanoflann::KDTreeSingleIndexAdaptor<nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>,_nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>
                  ).root_bbox._M_elems + -4) + uVar19 * 8);
    *(undefined8 *)
     ((long)((pKVar18->
             super_KDTreeBaseClass<nanoflann::KDTreeSingleIndexAdaptor<nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>,_nanoflann::L2_Simple_Adaptor<double,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_double>,_geometrycentral::(anonymous_namespace)::Vector3Adaptor,_3,_unsigned_long>
             ).root_bbox._M_elems + -4) + uVar19 * 8) = uVar5;
    uVar12 = uVar12 + 1;
    uVar19 = uVar19 - 1;
  } while( true );
}

Assistant:

NodePtr divideTree(Derived &obj, const IndexType left, const IndexType right,
                     BoundingBox &bbox) {
    NodePtr node = obj.pool.template allocate<Node>(); // allocate memory

    /* If too few exemplars remain, then make this a leaf node. */
    if ((right - left) <= static_cast<IndexType>(obj.m_leaf_max_size)) {
      node->child1 = node->child2 = NULL; /* Mark as leaf node. */
      node->node_type.lr.left = left;
      node->node_type.lr.right = right;

      // compute bounding-box of leaf points
      for (int i = 0; i < (DIM > 0 ? DIM : obj.dim); ++i) {
        bbox[i].low = dataset_get(obj, obj.vind[left], i);
        bbox[i].high = dataset_get(obj, obj.vind[left], i);
      }
      for (IndexType k = left + 1; k < right; ++k) {
        for (int i = 0; i < (DIM > 0 ? DIM : obj.dim); ++i) {
          if (bbox[i].low > dataset_get(obj, obj.vind[k], i))
            bbox[i].low = dataset_get(obj, obj.vind[k], i);
          if (bbox[i].high < dataset_get(obj, obj.vind[k], i))
            bbox[i].high = dataset_get(obj, obj.vind[k], i);
        }
      }
    } else {
      IndexType idx;
      int cutfeat;
      DistanceType cutval;
      middleSplit_(obj, &obj.vind[0] + left, right - left, idx, cutfeat, cutval,
                   bbox);

      node->node_type.sub.divfeat = cutfeat;

      BoundingBox left_bbox(bbox);
      left_bbox[cutfeat].high = cutval;
      node->child1 = divideTree(obj, left, left + idx, left_bbox);

      BoundingBox right_bbox(bbox);
      right_bbox[cutfeat].low = cutval;
      node->child2 = divideTree(obj, left + idx, right, right_bbox);

      node->node_type.sub.divlow = left_bbox[cutfeat].high;
      node->node_type.sub.divhigh = right_bbox[cutfeat].low;

      for (int i = 0; i < (DIM > 0 ? DIM : obj.dim); ++i) {
        bbox[i].low = std::min(left_bbox[i].low, right_bbox[i].low);
        bbox[i].high = std::max(left_bbox[i].high, right_bbox[i].high);
      }
    }

    return node;
  }